

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-test.cc
# Opt level: O0

void __thiscall
ProblemTest_InvalidLogicalConIndex_Test::TestBody(ProblemTest_InvalidLogicalConIndex_Test *this)

{
  bool bVar1;
  MutLogicalCon MVar2;
  AssertionFailure *e_1;
  bool gtest_caught_expected_1;
  string gtest_expected_message_1;
  AssertionResult gtest_ar_1;
  AssertionFailure *e;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar;
  int i;
  int num_cons;
  Problem p;
  undefined4 in_stack_fffffffffffffaf0;
  type_conflict in_stack_fffffffffffffaf4;
  undefined4 in_stack_fffffffffffffaf8;
  int in_stack_fffffffffffffafc;
  ExprBase in_stack_fffffffffffffb00;
  undefined4 in_stack_fffffffffffffb08;
  int in_stack_fffffffffffffb0c;
  ExprBase in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb18;
  Type in_stack_fffffffffffffb1c;
  BasicProblem<mp::BasicProblemParams<int>_> *in_stack_fffffffffffffb20;
  undefined7 in_stack_fffffffffffffb28;
  undefined1 in_stack_fffffffffffffb2f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  Message *in_stack_fffffffffffffb68;
  undefined4 in_stack_fffffffffffffb70;
  int in_stack_fffffffffffffb74;
  undefined1 local_429 [33];
  AssertionResult local_408 [3];
  int local_3d4;
  BasicProblem<mp::BasicProblemParams<int>_> *local_3d0;
  int local_3c8;
  byte local_3ba;
  allocator<char> local_3b9;
  string local_3b8 [32];
  AssertionResult local_398 [2];
  BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48> local_378;
  int local_368;
  undefined4 local_364;
  
  mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblem
            ((BasicProblem<mp::BasicProblemParams<int>_> *)in_stack_fffffffffffffb10.impl_);
  local_364 = 3;
  for (local_368 = 0; local_368 < 3; local_368 = local_368 + 1) {
    local_378.super_ExprBase.impl_ =
         (ExprBase)
         mp::BasicExprFactory<std::allocator<char>_>::MakeLogicalConstant
                   ((BasicExprFactory<std::allocator<char>_> *)
                    CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
                    SUB41((uint)in_stack_fffffffffffffaf4 >> 0x18,0));
    mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
              ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)
               CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8),
               (LogicalConstant)in_stack_fffffffffffffb00.impl_,in_stack_fffffffffffffaf4);
    mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCon
              ((BasicProblem<mp::BasicProblemParams<int>_> *)
               CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
               (LogicalExpr)in_stack_fffffffffffffb10.impl_);
  }
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_398);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb30,
               (char *)CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28),
               (allocator<char> *)in_stack_fffffffffffffb20);
    std::allocator<char>::~allocator(&local_3b9);
    local_3ba = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      MVar2 = mp::BasicProblem<mp::BasicProblemParams<int>_>::logical_con
                        ((BasicProblem<mp::BasicProblemParams<int>_> *)
                         in_stack_fffffffffffffb00.impl_,in_stack_fffffffffffffafc);
      local_3d0 = MVar2.
                  super_BasicLogicalCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                  .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
      in_stack_fffffffffffffb74 =
           MVar2.
           super_BasicLogicalCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
           .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
      local_3c8 = in_stack_fffffffffffffb74;
    }
    if ((local_3ba & 1) == 0) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)in_stack_fffffffffffffb20,
                 (char (*) [103])CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
      local_3d4 = 5;
    }
    else {
      local_3d4 = 0;
    }
    std::__cxx11::string::~string(local_3b8);
    if (local_3d4 != 0) goto LAB_0012701b;
  }
  else {
LAB_0012701b:
    testing::Message::Message((Message *)in_stack_fffffffffffffb20);
    testing::AssertionResult::failure_message((AssertionResult *)0x127037);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c,
               (char *)in_stack_fffffffffffffb10.impl_,in_stack_fffffffffffffb0c,
               (char *)in_stack_fffffffffffffb00.impl_);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
               in_stack_fffffffffffffb68);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
    testing::Message::~Message((Message *)0x127094);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1270ec);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_408);
  if (bVar1) {
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_429;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)CONCAT17(in_stack_fffffffffffffb2f,in_stack_fffffffffffffb28),
               (allocator<char> *)in_stack_fffffffffffffb20);
    std::allocator<char>::~allocator((allocator<char> *)local_429);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      MVar2 = mp::BasicProblem<mp::BasicProblemParams<int>_>::logical_con
                        ((BasicProblem<mp::BasicProblemParams<int>_> *)
                         in_stack_fffffffffffffb00.impl_,in_stack_fffffffffffffafc);
      in_stack_fffffffffffffb20 =
           MVar2.
           super_BasicLogicalCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
           .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
      in_stack_fffffffffffffb1c =
           MVar2.
           super_BasicLogicalCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
           .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)in_stack_fffffffffffffb20,
               (char (*) [109])CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
    local_3d4 = 6;
    std::__cxx11::string::~string((string *)(local_429 + 1));
    if (local_3d4 == 0) goto LAB_00127514;
  }
  testing::Message::Message((Message *)in_stack_fffffffffffffb20);
  testing::AssertionResult::failure_message((AssertionResult *)0x127471);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c,
             (char *)in_stack_fffffffffffffb10.impl_,in_stack_fffffffffffffb0c,
             (char *)in_stack_fffffffffffffb00.impl_);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70),
             in_stack_fffffffffffffb68);
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
  testing::Message::~Message((Message *)0x1274cc);
LAB_00127514:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x127521);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem
            ((BasicProblem<mp::BasicProblemParams<int>_> *)
             CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
  return;
}

Assistant:

TEST(ProblemTest, InvalidLogicalConIndex) {
  Problem p;
  const int num_cons = 3;
  for (int i = 0; i < num_cons; ++i)
    p.AddCon(p.MakeLogicalConstant(true));
  EXPECT_ASSERT(p.logical_con(-1), "invalid index");
  EXPECT_ASSERT(p.logical_con(num_cons), "invalid index");
}